

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idlist.h
# Opt level: O2

void __thiscall
soplex::IdList<soplex::SVSetBase<double>::DLPSV>::move
          (IdList<soplex::SVSetBase<double>::DLPSV> *this,ptrdiff_t delta)

{
  DLPSV *pDVar1;
  DLPSV **ppDVar2;
  DLPSV *pDVar3;
  
  if ((this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first == (DLPSV *)0x0) {
    return;
  }
  IsList<soplex::SVSetBase<double>::DLPSV>::move
            (&this->super_IsList<soplex::SVSetBase<double>::DLPSV>,delta);
  ppDVar2 = &(this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last;
  do {
    pDVar1 = *ppDVar2;
    do {
      do {
        pDVar3 = pDVar1;
        if (pDVar3 == (DLPSV *)0x0) {
          return;
        }
        pDVar1 = (DLPSV *)0x0;
      } while (pDVar3 == (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first);
      pDVar3->theprev =
           (DLPSV *)((long)&(pDVar3->theprev->super_SVectorBase<double>).m_elem + delta);
      pDVar1 = (DLPSV *)0x0;
    } while ((this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first == pDVar3);
    ppDVar2 = &pDVar3->theprev;
  } while( true );
}

Assistant:

void move(ptrdiff_t delta)
   {
      if(this->the_first)
      {
         T* elem;
         IsList<T>::move(delta);

         for(elem = last(); elem; elem = prev(elem))
            if(elem != first())
               elem->prev() = reinterpret_cast<T*>(
                                 reinterpret_cast<char*>(elem->prev()) + delta);
      }
   }